

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

int Iso_ObjHashAdd(Iso_Man_t *p,Iso_Obj_t *pIso)

{
  int iVar1;
  int iVar2;
  int in_EAX;
  uint Value;
  uint uVar3;
  int *piVar4;
  long lVar5;
  Iso_Obj_t *pIVar6;
  Iso_Obj_t *pIVar7;
  
  lVar5 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 ^ *(int *)(&pIso->field_0x0 + lVar5) *
                    *(int *)((long)If_CluHashKey::BigPrimes + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  uVar3 = uVar3 % (uint)p->nBins;
  p->nEntries = p->nEntries + 1;
  iVar1 = p->pBins[(int)uVar3];
  if (-1 < (long)iVar1) {
    iVar2 = p->nObjs;
    if (iVar1 < iVar2) {
      if (iVar1 == 0) {
        pIVar6 = (Iso_Obj_t *)0x0;
      }
      else {
        pIVar6 = p->pObjs + iVar1;
      }
      if (pIVar6 == (Iso_Obj_t *)0x0) {
        piVar4 = p->pBins + (int)uVar3;
      }
      else {
        do {
          pIVar7 = pIVar6;
          if (pIVar7->FanoutSig == pIso->FanoutSig && *(long *)pIVar7 == *(long *)pIso) {
            iVar1 = pIVar7->iClass;
            if (iVar1 == 0) {
              p->nClasses = p->nClasses + 1;
              p->nSingles = p->nSingles + -1;
            }
            pIso->iClass = iVar1;
            pIVar6 = p->pObjs;
            if ((pIVar6 < pIso) && (pIso < pIVar6 + iVar2)) {
              pIVar7->iClass = (int)((ulong)((long)pIso - (long)pIVar6) >> 3) * -0x55555555;
              return in_EAX;
            }
            goto LAB_0062967c;
          }
          iVar1 = pIVar7->iNext;
          if (((long)iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_0062965d;
          if (iVar1 == 0) {
            pIVar6 = (Iso_Obj_t *)0x0;
          }
          else {
            pIVar6 = p->pObjs + iVar1;
          }
        } while (pIVar6 != (Iso_Obj_t *)0x0);
        piVar4 = &pIVar7->iNext;
      }
      pIVar6 = p->pObjs;
      if ((pIVar6 < pIso) && (pIso < pIVar6 + iVar2)) {
        *piVar4 = (int)((ulong)((long)pIso - (long)pIVar6) >> 3) * -0x55555555;
        p->nSingles = p->nSingles + 1;
        return in_EAX;
      }
LAB_0062967c:
      __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                    ,0x12d,"int Iso_ObjId(Iso_Man_t *, Iso_Obj_t *)");
    }
  }
LAB_0062965d:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
}

Assistant:

static inline int Iso_ObjHashAdd( Iso_Man_t * p, Iso_Obj_t * pIso )
{
    Iso_Obj_t * pThis;
    int * pPlace = p->pBins + Iso_ObjHash( pIso, p->nBins );
    p->nEntries++;
    for ( pThis = Iso_ManObj(p, *pPlace); 
          pThis; pPlace = &pThis->iNext, 
          pThis = Iso_ManObj(p, *pPlace) )
        if ( Iso_ObjCompare( &pThis, &pIso ) == 0 ) // equal signatures
        {
            if ( pThis->iClass == 0 )
            {
                p->nClasses++;
                p->nSingles--;
            }
            // add to the list
            pIso->iClass = pThis->iClass;
            pThis->iClass = Iso_ObjId( p, pIso );
            return 1;
        }
    // create new list
    *pPlace = Iso_ObjId( p, pIso );
    p->nSingles++;
    return 0;
}